

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::anon_unknown_0::ComputeShaderBase::ValidateReadBufferCenteredQuad
          (ComputeShaderBase *this,int width,int height,vec3 *expected)

{
  float *pfVar1;
  byte bVar2;
  int y;
  int iVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  allocator_type local_41;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> fb;
  
  std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::vector
            (&fb,(long)(height * width),&local_41);
  glu::CallLogWrapper::glReadPixels
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0,0,width,height,0x1907
             ,0x1406,fb.
                     super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  fVar12 = (float)height * 0.1 + 1.0;
  iVar3 = (int)fVar12;
  iVar4 = (int)(((float)height - (fVar12 + fVar12)) + -1.0);
  if (iVar3 < iVar4) {
    fVar12 = (float)width * 0.1 + 1.0;
    iVar5 = (int)fVar12;
    iVar7 = (int)(((float)width - (fVar12 + fVar12)) + -1.0);
    fVar12 = (this->g_color_eps).m_data[0];
    iVar8 = iVar3 * width + iVar5;
    do {
      iVar9 = iVar7 - iVar5;
      iVar10 = iVar8;
      if (iVar5 < iVar7) {
        do {
          fVar13 = fb.
                   super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar10].m_data[0] - expected->m_data[0]
          ;
          fVar11 = -fVar13;
          if (-fVar13 <= fVar13) {
            fVar11 = fVar13;
          }
          if (fVar12 < fVar11) goto LAB_009110ec;
          fVar13 = fb.
                   super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar10].m_data[1] - expected->m_data[1]
          ;
          fVar11 = -fVar13;
          if (-fVar13 <= fVar13) {
            fVar11 = fVar13;
          }
          if ((this->g_color_eps).m_data[1] < fVar11) goto LAB_009110ec;
          fVar13 = fb.
                   super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar10].m_data[2] - expected->m_data[2]
          ;
          fVar11 = -fVar13;
          if (-fVar13 <= fVar13) {
            fVar11 = fVar13;
          }
          if ((this->g_color_eps).m_data[2] < fVar11) goto LAB_009110ec;
          iVar10 = iVar10 + 1;
          iVar9 = iVar9 + -1;
        } while (iVar9 != 0);
      }
      iVar3 = iVar3 + 1;
      iVar8 = iVar8 + width;
    } while (iVar3 != iVar4);
  }
  else {
    fVar12 = (this->g_color_eps).m_data[0];
  }
  iVar3 = width * 2 + 2;
  fVar11 = fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
           _M_impl.super__Vector_impl_data._M_start[iVar3].m_data[0];
  fVar13 = -fVar11;
  if (-fVar11 <= fVar11) {
    fVar13 = fVar11;
  }
  if (fVar12 < fVar13) {
LAB_00910fc5:
    bVar6 = false;
  }
  else {
    fVar11 = fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar3].m_data[1];
    fVar13 = -fVar11;
    if (-fVar11 <= fVar11) {
      fVar13 = fVar11;
    }
    pfVar1 = (this->g_color_eps).m_data + 1;
    if (*pfVar1 <= fVar13 && fVar13 != *pfVar1) goto LAB_00910fc5;
    fVar11 = fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar3].m_data[2];
    fVar13 = -fVar11;
    if (-fVar11 <= fVar11) {
      fVar13 = fVar11;
    }
    pfVar1 = (this->g_color_eps).m_data + 2;
    bVar6 = fVar13 < *pfVar1 || fVar13 == *pfVar1;
  }
  iVar3 = width * 3 + -3;
  fVar11 = fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
           _M_impl.super__Vector_impl_data._M_start[iVar3].m_data[0];
  fVar13 = -fVar11;
  if (-fVar11 <= fVar11) {
    fVar13 = fVar11;
  }
  if (fVar12 < fVar13) {
LAB_00911029:
    bVar2 = 0;
  }
  else {
    fVar11 = fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar3].m_data[1];
    fVar13 = -fVar11;
    if (-fVar11 <= fVar11) {
      fVar13 = fVar11;
    }
    pfVar1 = (this->g_color_eps).m_data + 1;
    if (*pfVar1 <= fVar13 && fVar13 != *pfVar1) goto LAB_00911029;
    fVar11 = fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar3].m_data[2];
    fVar13 = -fVar11;
    if (-fVar11 <= fVar11) {
      fVar13 = fVar11;
    }
    pfVar1 = (this->g_color_eps).m_data + 2;
    bVar2 = (fVar13 < *pfVar1 || fVar13 == *pfVar1) & bVar6;
  }
  iVar4 = (height + -3) * width;
  iVar3 = width + -3 + iVar4;
  fVar11 = fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
           _M_impl.super__Vector_impl_data._M_start[iVar3].m_data[0];
  fVar13 = -fVar11;
  if (-fVar11 <= fVar11) {
    fVar13 = fVar11;
  }
  if (fVar12 < fVar13) {
LAB_0091108d:
    bVar2 = 0;
  }
  else {
    fVar11 = fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar3].m_data[1];
    fVar13 = -fVar11;
    if (-fVar11 <= fVar11) {
      fVar13 = fVar11;
    }
    pfVar1 = (this->g_color_eps).m_data + 1;
    if (*pfVar1 <= fVar13 && fVar13 != *pfVar1) goto LAB_0091108d;
    fVar11 = fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar3].m_data[2];
    fVar13 = -fVar11;
    if (-fVar11 <= fVar11) {
      fVar13 = fVar11;
    }
    pfVar1 = (this->g_color_eps).m_data + 2;
    bVar2 = (fVar13 < *pfVar1 || fVar13 == *pfVar1) & bVar2;
  }
  iVar4 = iVar4 + 2;
  fVar11 = fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
           _M_impl.super__Vector_impl_data._M_start[iVar4].m_data[0];
  fVar13 = -fVar11;
  if (-fVar11 <= fVar11) {
    fVar13 = fVar11;
  }
  if (fVar13 <= fVar12) {
    fVar12 = fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar4].m_data[1];
    fVar11 = -fVar12;
    if (-fVar12 <= fVar12) {
      fVar11 = fVar12;
    }
    pfVar1 = (this->g_color_eps).m_data + 1;
    if (fVar11 < *pfVar1 || fVar11 == *pfVar1) {
      fVar12 = fb.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar4].m_data[2];
      fVar11 = -fVar12;
      if (-fVar12 <= fVar12) {
        fVar11 = fVar12;
      }
      pfVar1 = (this->g_color_eps).m_data + 2;
      bVar6 = (bool)((fVar11 < *pfVar1 || fVar11 == *pfVar1) & bVar2);
      goto LAB_009110ee;
    }
  }
LAB_009110ec:
  bVar6 = false;
LAB_009110ee:
  operator_delete(fb.
                  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
                  (long)fb.
                        super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)fb.
                        super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
  return bVar6;
}

Assistant:

bool ValidateReadBufferCenteredQuad(int width, int height, const vec3& expected)
	{
		bool			  result = true;
		std::vector<vec3> fb(width * height);
		glReadPixels(0, 0, width, height, GL_RGB, GL_FLOAT, &fb[0]);

		int startx = int(((float)width * 0.1f) + 1);
		int starty = int(((float)height * 0.1f) + 1);
		int endx   = int((float)width - 2 * (((float)width * 0.1f) + 1) - 1);
		int endy   = int((float)height - 2 * (((float)height * 0.1f) + 1) - 1);

		for (int y = starty; y < endy; ++y)
		{
			for (int x = startx; x < endx; ++x)
			{
				const int idx = y * width + x;
				if (!ColorEqual(fb[idx], expected, g_color_eps))
				{
					return false;
				}
			}
		}

		if (!ColorEqual(fb[2 * width + 2], vec3(0), g_color_eps))
		{
			result = false;
		}
		if (!ColorEqual(fb[2 * width + (width - 3)], vec3(0), g_color_eps))
		{
			result = false;
		}
		if (!ColorEqual(fb[(height - 3) * width + (width - 3)], vec3(0), g_color_eps))
		{
			result = false;
		}
		if (!ColorEqual(fb[(height - 3) * width + 2], vec3(0), g_color_eps))
		{
			result = false;
		}

		return result;
	}